

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxa_demangle.cpp
# Opt level: O3

char * __cxxabiv1::(anonymous_namespace)::
       parse_floating_number<long_double,__cxxabiv1::(anonymous_namespace)::Db>
                 (char *first,char *last,Db *db)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
  *paVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  char cVar7;
  long lVar8;
  char *pcVar9;
  anon_union_16_2_325080ff anon_var_0;
  char num [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
  *local_c8;
  size_type local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
  local_b8;
  char local_a8 [16];
  value_type local_98;
  char local_58 [40];
  
  if (0x14 < (ulong)((long)last - (long)first)) {
    lVar8 = 1;
    pcVar9 = local_b8._M_local_buf + 0xf;
    do {
      cVar3 = first[lVar8 + -1];
      iVar4 = isxdigit((int)cVar3);
      if (iVar4 == 0) {
        return first;
      }
      cVar7 = -0x57;
      if ((int)first[lVar8] - 0x30U < 10) {
        cVar7 = -0x30;
      }
      pcVar9[1] = cVar7 + first[lVar8] + ((9 < (int)cVar3 - 0x30U) * '\t' + cVar3) * '\x10';
      pcVar9 = pcVar9 + 1;
      lVar8 = lVar8 + 2;
    } while (lVar8 != 0x15);
    if (first[0x14] == 'E') {
      if (local_a8 < pcVar9) {
        pcVar6 = local_a8;
        do {
          pcVar6 = pcVar6 + 1;
          cVar3 = pcVar6[-1];
          pcVar6[-1] = *pcVar9;
          *pcVar9 = cVar3;
          pcVar9 = pcVar9 + -1;
        } while (pcVar6 < pcVar9);
      }
      local_58[0x10] = '\0';
      local_58[0x11] = '\0';
      local_58[0x12] = '\0';
      local_58[0x13] = '\0';
      local_58[0x14] = '\0';
      local_58[0x15] = '\0';
      local_58[0x16] = '\0';
      local_58[0x17] = '\0';
      local_58[0x18] = '\0';
      local_58[0x19] = '\0';
      local_58[0x1a] = '\0';
      local_58[0x1b] = '\0';
      local_58[0x1c] = '\0';
      local_58[0x1d] = '\0';
      local_58[0x1e] = '\0';
      local_58[0x1f] = '\0';
      local_58[0] = '\0';
      local_58[1] = '\0';
      local_58[2] = '\0';
      local_58[3] = '\0';
      local_58[4] = '\0';
      local_58[5] = '\0';
      local_58[6] = '\0';
      local_58[7] = '\0';
      local_58[8] = '\0';
      local_58[9] = '\0';
      local_58[10] = '\0';
      local_58[0xb] = '\0';
      local_58[0xc] = '\0';
      local_58[0xd] = '\0';
      local_58[0xe] = '\0';
      local_58[0xf] = '\0';
      local_58[0x20] = '\0';
      local_58[0x21] = '\0';
      local_58[0x22] = '\0';
      local_58[0x23] = '\0';
      local_58[0x24] = '\0';
      local_58[0x25] = '\0';
      local_58[0x26] = '\0';
      local_58[0x27] = '\0';
      uVar5 = snprintf(local_58,0x28,"%LaL");
      if (uVar5 < 0x28) {
        local_c8 = &local_b8;
        std::__cxx11::
        basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>
        ::_M_construct<char_const*>
                  ((basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>
                    *)&local_c8,local_58,local_58 + uVar5);
        paVar1 = &local_98.first.field_2;
        if (local_c8 == &local_b8) {
          local_98.first.field_2._8_8_ = local_b8._8_8_;
          local_98.first._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_98.first._M_dataplus._M_p = (pointer)local_c8;
        }
        paVar2 = &local_98.second.field_2;
        local_98.first._M_string_length = local_c0;
        local_c0 = 0;
        local_b8._M_local_buf[0] = '\0';
        local_98.second._M_string_length = 0;
        local_98.second.field_2._M_local_buf[0] = '\0';
        local_c8 = &local_b8;
        local_98.second._M_dataplus._M_p = (pointer)paVar2;
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back(&db->names,&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
             *)local_98.second._M_dataplus._M_p != paVar2) {
          free(local_98.second._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
             *)local_98.first._M_dataplus._M_p != paVar1) {
          free(local_98.first._M_dataplus._M_p);
        }
        if (local_c8 != &local_b8) {
          free(local_c8);
        }
        first = first + 0x15;
      }
    }
  }
  return first;
}

Assistant:

const char*
parse_floating_number(const char* first, const char* last, C& db)
{
    const size_t N = float_data<Float>::mangled_size;
    if (static_cast<std::size_t>(last - first) > N)
    {
        last = first + N;
        union
        {
            Float value;
            char buf[sizeof(Float)];
        };
        const char* t = first;
        char* e = buf;
        for (; t != last; ++t, ++e)
        {
            if (!isxdigit(*t))
                return first;
            unsigned d1 = isdigit(*t) ? static_cast<unsigned>(*t - '0') :
                                        static_cast<unsigned>(*t - 'a' + 10);
            ++t;
            unsigned d0 = isdigit(*t) ? static_cast<unsigned>(*t - '0') :
                                        static_cast<unsigned>(*t - 'a' + 10);
            *e = static_cast<char>((d1 << 4) + d0);
        }
        if (*t == 'E')
        {
#if __BYTE_ORDER__ == __ORDER_LITTLE_ENDIAN__
            std::reverse(buf, e);
#endif
            char num[float_data<Float>::max_demangled_size] = {0};
            int n = snprintf(num, sizeof(num), float_data<Float>::spec, value);
            if (static_cast<std::size_t>(n) >= sizeof(num))
                return first;
            db.names.push_back(typename C::String(num, static_cast<std::size_t>(n)));
            first = t+1;
        }
    }
    return first;
}